

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(int lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs)

{
  bool bVar1;
  char cVar2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_SIL;
  int in_EDI;
  int *unaff_retaddr;
  int ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  int in_stack_fffffffffffffff0;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffff4;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar4
  ;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff7;
  undefined2 in_stack_fffffffffffffffc;
  char cVar5;
  char in_stack_ffffffffffffffff;
  
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)&stack0xfffffffffffffff7);
  SVar4.m_int = in_SIL.m_int;
  bVar1 = DivisionCornerCaseHelper<signed_char,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_EDI,in_SIL,
                     (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff7);
  if ((!bVar1) &&
     (cVar5 = SVar4.m_int,
     bVar1 = DivisionCornerCaseHelper2<signed_char,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
             ::DivisionCornerCase2
                       (in_stack_fffffffffffffff0,in_SIL,
                        (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8)), !bVar1))
  {
    uVar3 = 0;
    cVar2 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)((ulong)CONCAT13(in_stack_fffffffffffffff7.m_int,
                                           CONCAT12(in_SIL.m_int,
                                                    CONCAT11(SVar4.m_int,in_stack_fffffffffffffff4))
                                          ) << 0x20));
    DivisionHelper<int,signed_char,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (unaff_retaddr,
               (char *)CONCAT17(in_stack_ffffffffffffffff,
                                CONCAT16(cVar5,CONCAT24(in_stack_fffffffffffffffc,in_EDI))),
               (int *)CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_SIL.m_int,
                                        CONCAT15(SVar4.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4,uVar3)))));
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_stack_fffffffffffffff7.m_int,
                             CONCAT16(in_SIL.m_int,
                                      CONCAT15(SVar4.m_int,CONCAT14(in_stack_fffffffffffffff4,uVar3)
                                              ))),(int *)CONCAT17(cVar2,in_stack_ffffffffffffffe8));
    in_stack_fffffffffffffff7.m_int = in_stack_ffffffffffffffff;
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )in_stack_fffffffffffffff7.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}